

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

bool CB_ADF::update_statistics(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  bool bVar1;
  action_score *paVar2;
  example *peVar3;
  reference ppeVar4;
  size_type sVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i_1;
  bool holdout_example;
  bool labeled_example;
  float loss;
  size_t i;
  uint32_t action;
  size_t num_features;
  ulong local_48;
  bool local_3e;
  float local_3c;
  example *peVar6;
  example *ec_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t uVar7;
  cb_class *observation;
  
  observation = (cb_class *)0x0;
  paVar2 = v_array<ACTION_SCORE::action_score>::operator[]
                     ((v_array<ACTION_SCORE::action_score> *)(in_RDX + 0x6850),0);
  uVar7 = paVar2->action;
  peVar6 = (example *)0x0;
  while (ec_00 = peVar6,
        peVar3 = (example *)std::vector<example_*,_std::allocator<example_*>_>::size(in_RCX),
        peVar6 < peVar3) {
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RCX,(size_type)ec_00);
    bVar1 = CB::ec_is_example_header(ec_00);
    if (!bVar1) {
      ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (in_RCX,(size_type)ec_00);
      observation = (cb_class *)((long)&observation->cost + (*ppeVar4)->num_features);
    }
    peVar6 = (example *)((long)&(ec_00->super_example_predict).indices._begin + 1);
  }
  local_3c = 0.0;
  bVar1 = 0.0 < *(float *)(in_RSI + 0x68);
  if (bVar1) {
    local_3c = CB_ALGS::get_unbiased_cost
                         (observation,(label *)CONCAT44(uVar7,in_stack_ffffffffffffffd0),
                          (uint32_t)((ulong)ec_00 >> 0x20));
  }
  local_3e = bVar1;
  for (local_48 = 0; sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RCX),
      local_48 < sVar5; local_48 = local_48 + 1) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RCX,local_48);
    local_3e = (local_3e & (*ppeVar4)->test_only & 1U) != 0;
  }
  shared_data::update((shared_data *)*in_RDI,local_3e,bVar1,local_3c,*(float *)(in_RDX + 0x6870),
                      (size_t)observation);
  return bVar1;
}

Assistant:

bool update_statistics(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  size_t num_features = 0;

  uint32_t action = ec.pred.a_s[0].action;
  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  float loss = 0.;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
    loss = get_unbiased_cost(&(c.gen_cs.known_cost), c.gen_cs.pred_scores, action);
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);
  return labeled_example;
}